

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::represent(Forth *this)

{
  uint dst;
  longlong lVar1;
  size_t count;
  double dVar2;
  longlong new_a_round;
  double new_a;
  int newlogDiv;
  int logaint;
  double loga;
  char buffer [32];
  int newLog;
  Cell Sign;
  uint address;
  uint length;
  double number;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"REPRESENT");
  requireDStackDepth(this,2,"REPRESENT");
  requireFStackDepth(this,1,"REPRESENT");
  _address = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  Sign = ForthStack<unsigned_int>::getTop(&this->dStack);
  dst = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  buffer._28_4_ = this->False;
  if (_address < 0.0) {
    buffer._28_4_ = this->True;
    _address = -_address;
  }
  if (0x1f < Sign) {
    Sign = 0x1f;
  }
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  if ((_address != 0.0) || (NAN(_address))) {
    dVar2 = log10(_address);
    dVar2 = floor(dVar2);
    buffer._24_4_ = (int)dVar2 + 1;
    dVar2 = pow(10.0,(double)(int)((int)dVar2 - (Sign - 1)));
    lVar1 = llround(_address / dVar2);
    sprintf((char *)&loga,"%lld",lVar1);
  }
  else {
    memset(&loga,0x30,(ulong)Sign);
    buffer[(ulong)Sign - 8] = '\0';
  }
  count = strlen((char *)&loga);
  moveIntoDataSpace(this,dst,(char *)&loga,count);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,buffer._24_4_);
  ForthStack<unsigned_int>::setTop(&this->dStack,buffer._28_4_);
  ForthStack<unsigned_int>::push(&this->dStack,this->True);
  return;
}

Assistant:

void represent(){
			REQUIRE_DSTACK_AVAILABLE(1, "REPRESENT");
			REQUIRE_DSTACK_DEPTH(2, "REPRESENT");
			REQUIRE_FSTACK_DEPTH(1, "REPRESENT");
			auto number=fStack.getTop();fStack.pop();
			auto length=dStack.getTop();
			auto address = (dStack.getTop(1)); 
			auto Sign=False;
			if(number<0.0){
				Sign=True;
				number=-number;
			}
if(length>31) length=31;
int newLog{};
char buffer[32];
if(number!=0.0){
 double loga=std::log10(number);
 int logaint=static_cast<int>(floor(loga));
 int newlogDiv=logaint-(length-1);
 newLog=logaint+1; 
 double new_a=number/pow(10,newlogDiv);
 auto new_a_round=std::llround(new_a);
 sprintf(buffer,"%lld",new_a_round);
} else {
  std::memset(buffer,'0',length);
  buffer[length]=0;
}
moveIntoDataSpace(address,buffer,std::strlen(buffer));
			if (1){
				dStack.setTop(1,newLog);
				dStack.setTop(Sign);
				dStack.push(True);
			}
		}